

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.h
# Opt level: O3

char * asmjit::_abi_1_10::Support::findPackedString(char *p,uint32_t id)

{
  char cVar1;
  uint32_t uVar2;
  
  if (id != 0) {
    uVar2 = 0;
    do {
      do {
        cVar1 = *p;
        p = p + 1;
      } while (cVar1 != '\0');
      uVar2 = uVar2 + 1;
    } while (uVar2 != id);
  }
  return p;
}

Assistant:

static ASMJIT_FORCE_INLINE const char* findPackedString(const char* p, uint32_t id) noexcept {
  uint32_t i = 0;
  while (i < id) {
    while (p[0])
      p++;
    p++;
    i++;
  }
  return p;
}